

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

DataBlob __thiscall
hrgls::datablob::DataBlobSource::GetNextBlob(DataBlobSource *this,timeval timeout)

{
  long *plVar1;
  long lVar2;
  mapped_type mVar3;
  pthread_t pVar4;
  mapped_type *pmVar5;
  long *plVar6;
  DataBlob emptyRet;
  hrgls_DataBlob blob;
  DataBlob DStack_48;
  key_type local_40;
  key_type local_38;
  
  plVar6 = (long *)timeout.tv_sec;
  DataBlob::DataBlob(&DStack_48);
  plVar1 = (long *)*plVar6;
  if (plVar1 != (long *)0x0) {
    if (*plVar1 != 0) {
      local_40._M_thread = 0;
      mVar3 = hrgls_DataBlobSourceGetNextBlob(*plVar1,&local_40,timeout.tv_usec);
      lVar2 = *plVar6;
      pVar4 = pthread_self();
      local_38._M_thread = pVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(lVar2 + 8),&local_38);
      *pmVar5 = mVar3;
      local_38._M_thread = pVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                             *)(*plVar6 + 8),&local_38);
      if (*pmVar5 == 1) {
        hrgls_DataBlobDestroy(local_40._M_thread);
        DataBlob::DataBlob((DataBlob *)this,&DStack_48);
      }
      else {
        DataBlob::DataBlob((DataBlob *)this,(hrgls_DataBlob)local_40._M_thread);
        hrgls_DataBlobDestroy(local_40._M_thread);
      }
      goto LAB_00104e13;
    }
    local_40._M_thread = pthread_self();
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[]((map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
                           *)(plVar1 + 1),&local_40);
    *pmVar5 = 0x3ee;
  }
  DataBlob::DataBlob((DataBlob *)this,&DStack_48);
LAB_00104e13:
  DataBlob::~DataBlob(&DStack_48);
  return (DataBlob)(DataBlob_private *)this;
}

Assistant:

DataBlob DataBlobSource::GetNextBlob(struct timeval timeout)
    {
      DataBlob emptyRet;
      if (!m_private) {
        return emptyRet;
      }
      if (!m_private->m_stream) {
        m_private->m_status[std::this_thread::get_id()] = hrgls_STATUS_NULL_OBJECT_POINTER;
        return emptyRet;
      }
      hrgls_DataBlob blob = nullptr;
      m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceGetNextBlob(m_private->m_stream, &blob, timeout);
      if (m_private->m_status[std::this_thread::get_id()] == hrgls_STATUS_TIMEOUT) {
        hrgls_DataBlobDestroy(blob);
        return emptyRet;
      }
      DataBlob ret(blob);
      hrgls_DataBlobDestroy(blob);
      return ret;
    }